

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O3

char * __thiscall dtc::dirname(dtc *this,char *__path)

{
  code *local_28;
  undefined8 local_20;
  code *local_18;
  code *local_10;
  
  local_20 = 0;
  local_28 = ::dirname;
  local_10 = std::_Function_handler<char_*(char_*),_char_*(*)(char_*)_noexcept>::_M_invoke;
  local_18 = std::_Function_handler<char_*(char_*),_char_*(*)(char_*)_noexcept>::_M_manager;
  anon_unknown_3::dirbasename
            ((string *)this,(anon_unknown_3 *)&local_28,*(function<char_*(char_*)> **)__path,
             *(string **)(__path + 8));
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,3);
  }
  return (char *)this;
}

Assistant:

string dirname(const string &s)
{
	return dirbasename(::dirname, s);
}